

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU
          (Environmental_Process_PDU *this,EntityIdentifier *EnvironmentalProcessID,
          EnvironmentType *ET,KUINT8 ModelType,KBOOL EnvironmentStatusLast,KBOOL EnvironmentStatusOn
          ,KUINT16 SequenceNumber)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Environmental_Process_PDU_002215b0;
  (this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c98;
  KVar1 = (EnvironmentalProcessID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EnvProcID).super_SimulationIdentifier.m_ui16SiteID =
       (EnvironmentalProcessID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EnvProcID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220c00;
  *(undefined2 *)&(this->m_EnvProcID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EnvironmentalProcessID->super_SimulationIdentifier).field_0xc;
  (this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EnvironmentType_00220da0;
  KVar2 = ET->m_ui8Domain;
  KVar1 = ET->m_ui16Class;
  KVar3 = ET->m_ui8Category;
  KVar4 = ET->m_ui8SubCategory;
  KVar5 = ET->m_ui8Specific;
  KVar6 = ET->m_ui8Extra;
  (this->m_EnvType).m_ui8EntityKind = ET->m_ui8EntityKind;
  (this->m_EnvType).m_ui8Domain = KVar2;
  (this->m_EnvType).m_ui16Class = KVar1;
  (this->m_EnvType).m_ui8Category = KVar3;
  (this->m_EnvType).m_ui8SubCategory = KVar4;
  (this->m_EnvType).m_ui8Specific = KVar5;
  (this->m_EnvType).m_ui8Extra = KVar6;
  this->m_ui8ModelType = ModelType;
  (this->field_3).m_ui8EnvStatus =
       EnvironmentStatusOn * '\x02' | EnvironmentStatusLast | (this->field_3).m_ui8EnvStatus & 0xfc;
  this->m_ui16NumEnvRec = 0;
  this->m_ui16SeqNum = SequenceNumber;
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = ')';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Environmental_Process_PDU::Environmental_Process_PDU( const EntityIdentifier & EnvironmentalProcessID, const EnvironmentType & ET,
        KUINT8 ModelType, KBOOL EnvironmentStatusLast, KBOOL EnvironmentStatusOn,
        KUINT16 SequenceNumber ) :
    m_EnvProcID( EnvironmentalProcessID ),
    m_EnvType( ET ),
    m_ui8ModelType( ModelType ),
    m_ui8EnvStatusBit0( EnvironmentStatusLast ),
    m_ui8EnvStatusBit1( EnvironmentStatusOn ),
    m_ui16NumEnvRec( 0 ),
    m_ui16SeqNum( SequenceNumber )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = EnvironmentalProcess_PDU_Type;
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}